

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void spr_write_xer(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  arg1 = cpu_gpr[gprn];
  tcg_gen_andi_i64_ppc64(tcg_ctx,cpu_xer,arg1,0x1ff3ffff);
  tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ov32,arg1,0x13,1);
  tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ca32,arg1,0x12,1);
  tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_so,arg1,0x1f,1);
  tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ov,arg1,0x1e,1);
  tcg_gen_extract_i64_ppc64(tcg_ctx,cpu_ca,arg1,0x1d,1);
  return;
}

Assistant:

static void spr_write_xer(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_write_xer(tcg_ctx, cpu_gpr[gprn]);
}